

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pseudo-types.cpp
# Opt level: O0

void yactfr::internal::anon_unknown_23::validateNoMappedClkTypeId(PseudoDt *basePseudoDt)

{
  bool bVar1;
  TextLocation *pTVar2;
  anon_class_1_0_00000001 *in_RCX;
  allocator local_71;
  string local_70;
  undefined1 local_49 [9];
  Set pseudoDts;
  PseudoDt *basePseudoDt_local;
  
  pseudoDts._M_h._M_single_bucket = (__node_base_ptr)basePseudoDt;
  findPseudoUIntTypes<yactfr::internal::PseudoDt_const,yactfr::internal::(anonymous_namespace)::validateNoMappedClkTypeId(yactfr::internal::PseudoDt_const&)::__0>
            ((Set *)(local_49 + 1),(internal *)basePseudoDt,(PseudoDt *)local_49,in_RCX);
  bVar1 = std::
          unordered_set<const_yactfr::internal::PseudoDt_*,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::allocator<const_yactfr::internal::PseudoDt_*>_>
          ::empty((unordered_set<const_yactfr::internal::PseudoDt_*,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::allocator<const_yactfr::internal::PseudoDt_*>_>
                   *)(local_49 + 1));
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_70,
               "At least one fixed-length unsigned integer type is mapped to a clock type; this isn\'t not supported within this scope."
               ,&local_71);
    pTVar2 = PseudoDt::loc((PseudoDt *)pseudoDts._M_h._M_single_bucket);
    throwTextParseError(&local_70,*pTVar2);
  }
  std::
  unordered_set<const_yactfr::internal::PseudoDt_*,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::allocator<const_yactfr::internal::PseudoDt_*>_>
  ::~unordered_set((unordered_set<const_yactfr::internal::PseudoDt_*,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::allocator<const_yactfr::internal::PseudoDt_*>_>
                    *)(local_49 + 1));
  return;
}

Assistant:

auto validateNoMappedClkTypeId(const PseudoDt& basePseudoDt)
{
    const auto pseudoDts = findPseudoUIntTypes(basePseudoDt, [](auto& pseudoIntType, auto) {
        if (!isFlUIntNotDtWrapper(pseudoIntType)) {
            return false;
        }

        return static_cast<const PseudoFlUIntType&>(pseudoIntType).mappedClkTypeId().has_value();
    });

    if (!pseudoDts.empty()) {
        throwTextParseError("At least one fixed-length unsigned integer type "
                            "is mapped to a clock type; "
                            "this isn't not supported within this scope.",
                            basePseudoDt.loc());
    }
}